

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O2

void __thiscall
mp::LinTerms::
fold_into<gch::small_vector<std::pair<int,double>,256u,std::allocator<std::pair<int,double>>>>
          (LinTerms *this,
          small_vector<std::pair<int,_double>,_256U,_std::allocator<std::pair<int,_double>_>_> *vec)

{
  size_t i;
  ulong uVar1;
  pair<int,_double> local_30;
  
  gch::detail::small_vector_base<std::allocator<std::pair<int,_double>_>,_256U>::resize_with<>
            (&vec->super_small_vector_base<std::allocator<std::pair<int,_double>_>,_256U>,
             (this->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_size);
  for (uVar1 = 0;
      uVar1 < (this->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_size; uVar1 = uVar1 + 1) {
    local_30.first =
         (this->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr[uVar1];
    local_30.second =
         (this->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr[uVar1];
    gch::detail::small_vector_base<std::allocator<std::pair<int,double>>,256u>::
    append_element<std::pair<int,double>>
              ((small_vector_base<std::allocator<std::pair<int,double>>,256u> *)vec,&local_30);
  }
  return;
}

Assistant:

void LinTerms::fold_into(Vec& vec) {
  vec.resize(size());
  for (size_t i=0; i<size(); ++i)
    vec.push_back({ var(i), coef(i) });
}